

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O3

bool cmPolicies::ApplyPolicyVersion(cmMakefile *mf,uint majorVer,uint minorVer,uint patchVer)

{
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *__s;
  string *psVar5;
  ostream *poVar6;
  cmState *this;
  uint uVar7;
  PolicyID id;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  string defaultVar;
  ostringstream e;
  PolicyStatus local_210;
  allocator<char> local_209;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  bVar10 = 2 < majorVer;
  bVar13 = majorVer != 3;
  uVar8 = minorVer + 1;
  uVar7 = patchVer + 1;
  bVar14 = patchVer == 0xffffffff;
  bVar11 = uVar8 < 9;
  bVar15 = minorVer == 8;
  bVar12 = uVar8 < 7;
  bVar16 = minorVer == 6;
  bVar9 = bVar15 && bVar14 || bVar11;
  id = CMP0000;
  do {
    switch(id) {
    case CMP0000:
    case CMP0001:
    case CMP0002:
    case CMP0003:
    case CMP0004:
    case CMP0005:
    case CMP0006:
    case CMP0007:
      uVar1 = (!bVar16 || !bVar14) && !bVar12;
      goto joined_r0x00242a21;
    case CMP0008:
      bVar2 = uVar7 < 2;
      break;
    case CMP0009:
      bVar2 = uVar7 < 3;
      break;
    case CMP0010:
    case CMP0011:
      bVar2 = uVar7 < 4 && bVar16 || bVar12;
      goto joined_r0x00242a14;
    case CMP0012:
    case CMP0013:
    case CMP0014:
      bVar2 = bVar9;
joined_r0x00242a14:
      uVar1 = !bVar2;
      goto joined_r0x00242a21;
    case CMP0015:
      bVar2 = uVar7 < 2;
      goto joined_r0x00242ab1;
    case CMP0016:
      bVar2 = uVar7 < 4;
joined_r0x00242ab1:
      uVar1 = (!bVar15 || !bVar2) && !bVar11;
      goto joined_r0x00242a21;
    case CMP0017:
      bVar2 = uVar7 < 5;
      goto joined_r0x00242b11;
    case CMP0018:
      bVar2 = uVar7 < 10;
joined_r0x00242b11:
      uVar1 = (!bVar2 || !bVar15) && !bVar11;
      goto joined_r0x00242a21;
    case CMP0019:
    case CMP0020:
      bVar2 = uVar7 < 0xc;
      goto joined_r0x00242a21;
    case CMP0021:
    case CMP0022:
    case CMP0023:
      bVar2 = uVar7 < 0xd;
joined_r0x00242a21:
      uVar1 = (!bVar2 || !bVar15) && !bVar11;
      goto joined_r0x00242a21;
    case CMP0024:
    case CMP0025:
    case CMP0026:
    case CMP0027:
    case CMP0028:
    case CMP0029:
    case CMP0030:
    case CMP0031:
    case CMP0032:
    case CMP0033:
    case CMP0034:
    case CMP0035:
    case CMP0036:
    case CMP0037:
    case CMP0038:
    case CMP0039:
    case CMP0040:
    case CMP0041:
    case CMP0042:
    case CMP0043:
    case CMP0044:
    case CMP0045:
    case CMP0046:
    case CMP0047:
    case CMP0048:
    case CMP0049:
    case CMP0050:
      if (((minorVer != 0 || !bVar14) && minorVer != 0xffffffff || bVar13) && bVar10)
      goto switchD_002426cf_default;
      goto LAB_002426da;
    case CMP0051:
    case CMP0052:
    case CMP0053:
    case CMP0054:
      bVar2 = minorVer == 1 && bVar14 || uVar8 < 2;
      goto joined_r0x00242a91;
    case CMP0055:
    case CMP0056:
      bVar2 = minorVer == 2 && bVar14 || uVar8 < 3;
joined_r0x00242a91:
      if (bVar2 && !bVar13 || !bVar10) goto LAB_002426da;
      goto switchD_002426cf_default;
    case CMP0057:
    case CMP0058:
    case CMP0059:
    case CMP0060:
    case CMP0061:
    case CMP0062:
    case CMP0063:
      bVar2 = minorVer == 3 && bVar14 || uVar8 < 4;
      goto joined_r0x00242a61;
    case CMP0064:
    case CMP0065:
      bVar2 = minorVer == 4 && bVar14 || uVar8 < 5;
joined_r0x00242a61:
      if (bVar2 && !bVar13 || !bVar10) goto LAB_002426da;
      goto switchD_002426cf_default;
    case CMP0066:
      bVar2 = minorVer == 7 && bVar14 || uVar8 < 8;
      goto joined_r0x00242ac1;
    case CMP0067:
      bVar2 = bVar9;
joined_r0x00242ac1:
      if (!bVar13 && bVar2 || !bVar10) goto LAB_002426da;
      goto switchD_002426cf_default;
    case CMP0068:
    case CMP0069:
      bVar2 = minorVer == 9 && bVar14 || uVar8 < 10;
      goto joined_r0x00242a41;
    case CMP0070:
    case CMP0071:
      bVar2 = minorVer == 10 && bVar14 || uVar8 < 0xb;
joined_r0x00242a41:
      if (bVar2 && !bVar13 || !bVar10) goto LAB_002426da;
      goto switchD_002426cf_default;
    case CMP0072:
      bVar2 = minorVer == 0xb && bVar14 || uVar8 < 0xc;
      goto joined_r0x00242a31;
    case CMP0073:
    case CMP0074:
    case CMP0075:
      bVar2 = minorVer == 0xc && bVar14 || uVar8 < 0xd;
joined_r0x00242a31:
      if (bVar2 && !bVar13 || !bVar10) goto LAB_002426da;
      goto switchD_002426cf_default;
    case CMP0076:
    case CMP0077:
    case CMP0078:
    case CMP0079:
    case CMP0080:
    case CMP0081:
      bVar2 = minorVer == 0xd && bVar14 || uVar8 < 0xe;
      goto joined_r0x002429e0;
    case CMP0082:
    case CMP0083:
    case CMP0084:
    case CMP0085:
    case CMP0086:
    case CMP0087:
    case CMP0088:
      bVar2 = minorVer == 0xe && bVar14 || uVar8 < 0xf;
joined_r0x002429e0:
      if (bVar2 && !bVar13 || !bVar10) goto LAB_002426da;
      goto switchD_002426cf_default;
    case CMP0089:
    case CMP0090:
    case CMP0091:
    case CMP0092:
    case CMP0093:
    case CMP0094:
      bVar2 = minorVer == 0xf && bVar14 || uVar8 < 0x10;
      goto joined_r0x00242b31;
    case CMP0095:
      bVar2 = minorVer == 0x10 && bVar14 || uVar8 < 0x11;
joined_r0x00242b31:
      if (bVar2 && !bVar13 || !bVar10) goto LAB_002426da;
    default:
      goto switchD_002426cf_default;
    }
    uVar1 = (!bVar2 || !bVar16) && !bVar12;
joined_r0x00242a21:
    if (((bool)uVar1 || majorVer != 2) && 1 < majorVer) {
switchD_002426cf_default:
      bVar2 = cmMakefile::SetPolicy(mf,id,NEW);
      if (!bVar2) {
        return false;
      }
    }
    else {
LAB_002426da:
      __s = idToString(id);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,__s,&local_209);
      std::operator+(&local_1e8,"CMAKE_POLICY_DEFAULT_",&local_208);
      psVar5 = cmMakefile::GetSafeDefinition(mf,&local_1e8);
      iVar3 = std::__cxx11::string::compare((char *)psVar5);
      bVar2 = true;
      if (iVar3 == 0) {
        local_210 = NEW;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)psVar5);
        if (iVar4 == 0) {
          local_210 = OLD;
        }
        else {
          local_210 = WARN;
          if (psVar5->_M_string_length != 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,
                                local_1e8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," has value \"",0xc);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,"\" but must be \"OLD\", \"NEW\", or \"\" (empty).",0x2a);
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_1c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            bVar2 = false;
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if (!bVar2) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        return false;
      }
      bVar2 = cmMakefile::SetPolicy(mf,id,local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if (!bVar2) {
        return false;
      }
      if (id == CMP0001 && iVar3 != 0) {
        this = cmMakefile::GetState(mf);
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"CMAKE_BACKWARDS_COMPATIBILITY","");
        psVar5 = cmState::GetInitializedCacheValue(this,(string *)local_1a8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
        }
        if (psVar5 == (string *)0x0) {
          local_1a8._0_8_ = local_1a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"CMAKE_BACKWARDS_COMPATIBILITY","");
          cmMakefile::AddCacheDefinition
                    (mf,(string *)local_1a8,"2.4",
                     "For backwards compatibility, what version of CMake commands and syntax should this version of CMake try to support."
                     ,STRING,false);
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
          }
        }
      }
    }
    id = id + CMP0001;
    if (id == CMPCOUNT) {
      return true;
    }
  } while( true );
}

Assistant:

bool cmPolicies::ApplyPolicyVersion(cmMakefile* mf, unsigned int majorVer,
                                    unsigned int minorVer,
                                    unsigned int patchVer)
{
  // now loop over all the policies and set them as appropriate
  std::vector<cmPolicies::PolicyID> ancientPolicies;
  for (PolicyID pid = cmPolicies::CMP0000; pid != cmPolicies::CMPCOUNT;
       pid = PolicyID(pid + 1)) {
    if (isPolicyNewerThan(pid, majorVer, minorVer, patchVer)) {
      if (cmPolicies::GetPolicyStatus(pid) == cmPolicies::REQUIRED_ALWAYS) {
        ancientPolicies.push_back(pid);
      } else {
        cmPolicies::PolicyStatus status = cmPolicies::WARN;
        if (!GetPolicyDefault(mf, idToString(pid), &status) ||
            !mf->SetPolicy(pid, status)) {
          return false;
        }
        if (pid == cmPolicies::CMP0001 &&
            (status == cmPolicies::WARN || status == cmPolicies::OLD)) {
          if (!(mf->GetState()->GetInitializedCacheValue(
                "CMAKE_BACKWARDS_COMPATIBILITY"))) {
            // Set it to 2.4 because that is the last version where the
            // variable had meaning.
            mf->AddCacheDefinition(
              "CMAKE_BACKWARDS_COMPATIBILITY", "2.4",
              "For backwards compatibility, what version of CMake "
              "commands and "
              "syntax should this version of CMake try to support.",
              cmStateEnums::STRING);
          }
        }
      }
    } else {
      if (!mf->SetPolicy(pid, cmPolicies::NEW)) {
        return false;
      }
    }
  }

  // Make sure the project does not use any ancient policies.
  if (!ancientPolicies.empty()) {
    DiagnoseAncientPolicies(ancientPolicies, majorVer, minorVer, patchVer, mf);
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  return true;
}